

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

callbacks __thiscall
pstore::exchange::import_ns::callbacks::
make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
          (callbacks *this,not_null<pstore::database_*> db,section_kind args,string_mapping *args_1,
          section_content *args_2,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *args_3)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  callbacks cVar1;
  element_type *local_60;
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_pstore::repo::section_kind,_pstore::exchange::import_ns::string_mapping_*,_pstore::repo::section_content_*,_std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_pstore::repo::section_kind,_pstore::exchange::import_ns::string_mapping_*,_pstore::repo::section_content_*,_std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>_>_>
  local_58;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_50;
  undefined1 local_48 [8];
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *args_local_3;
  section_content *args_local_2;
  string_mapping *args_local_1;
  not_null<pstore::database_*> nStack_18;
  section_kind args_local;
  not_null<pstore::database_*> db_local;
  
  ctxt.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_3;
  args_local_3 = (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
                  *)args_2;
  args_local_2 = (section_content *)args_1;
  args_local_1._7_1_ = args;
  nStack_18.ptr_ = db.ptr_;
  db_local.ptr_ = (database *)this;
  std::
  make_shared<pstore::exchange::import_ns::context,pstore::gsl::not_null<pstore::database*>const&>
            ((not_null<pstore::database_*> *)local_48);
  local_60 = std::__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>::
             get((__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2> *)
                 local_48);
  std::
  make_unique<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>,pstore::exchange::import_ns::context*,pstore::repo::section_kind&,pstore::exchange::import_ns::string_mapping*&,pstore::repo::section_content*&,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*&>
            ((context **)&local_58,(section_kind *)&local_60,
             (string_mapping **)((long)&args_local_1 + 7),&args_local_2,&args_local_3);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>,std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_50,&local_58);
  callbacks(this,(shared_ptr<pstore::exchange::import_ns::context> *)local_48,&local_50);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_50);
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_pstore::repo::section_kind,_pstore::exchange::import_ns::string_mapping_*,_pstore::repo::section_content_*,_std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_pstore::repo::section_kind,_pstore::exchange::import_ns::string_mapping_*,_pstore::repo::section_content_*,_std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_*>_>_>
  ::~unique_ptr(&local_58);
  std::shared_ptr<pstore::exchange::import_ns::context>::~shared_ptr
            ((shared_ptr<pstore::exchange::import_ns::context> *)local_48);
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (callbacks)
         cVar1.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }